

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

int scratch_attr_too_big(_internal_exr_seq_scratch *scr,int32_t attrsz,int64_t fsize)

{
  int64_t foff;
  int64_t test;
  int64_t acmp;
  int64_t fsize_local;
  int32_t attrsz_local;
  _internal_exr_seq_scratch *scr_local;
  int local_4;
  
  if (((fsize < 1) || ((long)attrsz <= scr->navail)) ||
     ((long)(scr->fileoff + ((long)attrsz - scr->navail)) <= fsize)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline int
scratch_attr_too_big (
    struct _internal_exr_seq_scratch* scr, int32_t attrsz, int64_t fsize)
{
    int64_t acmp = (int64_t) attrsz;
    if (fsize > 0 && (acmp > scr->navail))
    {
        int64_t test = acmp - scr->navail;
        int64_t foff = (int64_t) scr->fileoff;
        if ((foff + test) > fsize) return 1;
    }
    return 0;
}